

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

void __thiscall AddressFilter::AddToList(AddressFilter *this,char *addrText)

{
  int iVar1;
  undefined1 local_3c [8];
  in6_addr ipv6_addr;
  in_addr ipv4_addr;
  size_t addr_len;
  uint8_t *addr_bin;
  char *addrText_local;
  AddressFilter *this_local;
  
  addr_len = 0;
  stack0xffffffffffffffd8 = 0;
  iVar1 = inet_pton(2,addrText,(void *)((long)&ipv6_addr.__in6_u + 8));
  if (iVar1 == 1) {
    addr_len = (long)&ipv6_addr.__in6_u + 8;
    stack0xffffffffffffffd8 = 4;
  }
  else {
    iVar1 = inet_pton(10,addrText,local_3c);
    if (iVar1 == 1) {
      addr_len = (size_t)local_3c;
      stack0xffffffffffffffd8 = 0x10;
    }
  }
  if (stack0xffffffffffffffd8 != 0) {
    AddToList(this,(uint8_t *)addr_len,stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void AddressFilter::AddToList(char const * addrText)
{
    uint8_t * addr_bin = NULL;
    size_t addr_len = 0;
    struct in_addr ipv4_addr;
    struct in6_addr ipv6_addr;

    if (inet_pton(AF_INET, addrText, &ipv4_addr) == 1)
    {
        /* Valid IPv4 address */
        addr_bin = (uint8_t *)&ipv4_addr;
        addr_len = sizeof(struct in_addr);
    }
    else  if (inet_pton(AF_INET6, addrText, &ipv6_addr) == 1)
    {
        /* Valid IPv6 address */
        addr_bin = (uint8_t *)&ipv6_addr;
        addr_len = sizeof(struct in6_addr);
    }

    if (addr_len > 0)
    {
        AddToList(addr_bin, addr_len);
    }
}